

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

string * duckdb::NumericHelper::ToString<signed_char>(string *__return_storage_ptr__,char value)

{
  undefined3 in_register_00000031;
  
  ::std::__cxx11::to_string(__return_storage_ptr__,CONCAT31(in_register_00000031,value));
  return __return_storage_ptr__;
}

Assistant:

static std::string ToString(T value) {
		return std::to_string(value);
	}